

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

void tt_cmap4_next(TT_CMap4 cmap)

{
  uint uVar1;
  int iVar2;
  FT_Face pFVar3;
  long lVar4;
  FT_CharMap *ppFVar5;
  uint uVar6;
  FT_Int FVar7;
  uint local_48;
  FT_UInt gindex_1;
  FT_UInt gindex;
  FT_Byte *p;
  FT_Int delta;
  FT_UInt end;
  FT_Byte *values;
  FT_UInt charcode;
  FT_Byte *limit;
  TT_Face face;
  TT_CMap4 cmap_local;
  
  pFVar3 = (cmap->cmap).cmap.charmap.face;
  lVar4 = *(long *)&pFVar3[3].num_charmaps;
  ppFVar5 = pFVar3[3].charmaps;
  if (cmap->cur_charcode < 0xffff) {
    values._4_4_ = cmap->cur_charcode + 1;
    if (values._4_4_ < cmap->cur_start) {
      values._4_4_ = cmap->cur_start;
    }
LAB_0033ba4a:
    uVar1 = cmap->cur_end;
    iVar2 = cmap->cur_delta;
    if (values._4_4_ <= uVar1) {
      if (cmap->cur_values == (FT_Byte *)0x0) {
        do {
          local_48 = values._4_4_ + iVar2 & 0xffff;
          if ((uint)pFVar3->num_glyphs <= local_48) {
            local_48 = 0;
            if (((int)(values._4_4_ + iVar2) < 0) && (-1 < (int)(uVar1 + iVar2))) {
              values._4_4_ = -iVar2;
            }
            else {
              if ((0xffff < (int)(values._4_4_ + iVar2)) || ((int)(uVar1 + iVar2) < 0x10000)) break;
              values._4_4_ = 0x10000 - iVar2;
            }
          }
          if (local_48 != 0) {
            cmap->cur_charcode = values._4_4_;
            cmap->cur_gindex = local_48;
            return;
          }
          values._4_4_ = values._4_4_ + 1;
        } while (values._4_4_ <= uVar1);
      }
      else {
        _gindex_1 = cmap->cur_values + (values._4_4_ - cmap->cur_start) * 2;
        if (_gindex_1 <= (FT_Byte *)(lVar4 + (long)ppFVar5)) {
          do {
            if ((CONCAT11(*_gindex_1,_gindex_1[1]) != 0) &&
               (uVar6 = (uint)CONCAT11(*_gindex_1,_gindex_1[1]) + iVar2 & 0xffff, uVar6 != 0)) {
              cmap->cur_charcode = values._4_4_;
              cmap->cur_gindex = uVar6;
              return;
            }
            values._4_4_ = values._4_4_ + 1;
            _gindex_1 = _gindex_1 + 2;
          } while (values._4_4_ <= uVar1);
        }
      }
    }
    FVar7 = tt_cmap4_set_range(cmap,cmap->cur_range + 1);
    if (-1 < FVar7) {
      if (values._4_4_ < cmap->cur_start) {
        values._4_4_ = cmap->cur_start;
      }
      goto LAB_0033ba4a;
    }
  }
  cmap->cur_charcode = 0xffffffff;
  cmap->cur_gindex = 0;
  return;
}

Assistant:

static void
  tt_cmap4_next( TT_CMap4  cmap )
  {
    TT_Face   face  = (TT_Face)cmap->cmap.cmap.charmap.face;
    FT_Byte*  limit = face->cmap_table + face->cmap_size;

    FT_UInt  charcode;


    if ( cmap->cur_charcode >= 0xFFFFUL )
      goto Fail;

    charcode = (FT_UInt)cmap->cur_charcode + 1;

    if ( charcode < cmap->cur_start )
      charcode = cmap->cur_start;

    for (;;)
    {
      FT_Byte*  values = cmap->cur_values;
      FT_UInt   end    = cmap->cur_end;
      FT_Int    delta  = cmap->cur_delta;


      if ( charcode <= end )
      {
        if ( values )
        {
          FT_Byte*  p = values + 2 * ( charcode - cmap->cur_start );


          /* if p > limit, the whole segment is invalid */
          if ( p > limit )
            goto Next_Segment;

          do
          {
            FT_UInt  gindex = FT_NEXT_USHORT( p );


            if ( gindex )
            {
              gindex = (FT_UInt)( (FT_Int)gindex + delta ) & 0xFFFFU;
              if ( gindex )
              {
                cmap->cur_charcode = charcode;
                cmap->cur_gindex   = gindex;
                return;
              }
            }
          } while ( ++charcode <= end );
        }
        else
        {
          do
          {
            FT_UInt  gindex = (FT_UInt)( (FT_Int)charcode + delta ) & 0xFFFFU;


            if ( gindex >= (FT_UInt)face->root.num_glyphs )
            {
              /* we have an invalid glyph index; if there is an overflow, */
              /* we can adjust `charcode', otherwise the whole segment is */
              /* invalid                                                  */
              gindex = 0;

              if ( (FT_Int)charcode + delta < 0 &&
                   (FT_Int)end + delta >= 0     )
                charcode = (FT_UInt)( -delta );

              else if ( (FT_Int)charcode + delta < 0x10000L &&
                        (FT_Int)end + delta >= 0x10000L     )
                charcode = (FT_UInt)( 0x10000L - delta );

              else
                goto Next_Segment;
            }

            if ( gindex )
            {
              cmap->cur_charcode = charcode;
              cmap->cur_gindex   = gindex;
              return;
            }
          } while ( ++charcode <= end );
        }
      }

    Next_Segment:
      /* we need to find another range */
      if ( tt_cmap4_set_range( cmap, cmap->cur_range + 1 ) < 0 )
        break;

      if ( charcode < cmap->cur_start )
        charcode = cmap->cur_start;
    }

  Fail:
    cmap->cur_charcode = (FT_UInt32)0xFFFFFFFFUL;
    cmap->cur_gindex   = 0;
  }